

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

_Bool patch_reloc(tcg_insn_unit *code_ptr,int type,intptr_t value,intptr_t addend)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  tcg_insn_unit tVar5;
  int iVar6;
  long lVar7;
  ulong extraout_RDX;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  
  lVar7 = value + addend;
  if (type != 1) {
    if (type == 0x17) {
      tVar5 = (tcg_insn_unit)(lVar7 - (long)code_ptr);
      if ((long)(char)tVar5 == lVar7 - (long)code_ptr) {
        *code_ptr = tVar5;
        return true;
      }
      return false;
    }
    if (type != 2) {
      patch_reloc_cold_1();
      lVar7 = (long)type;
      iVar6 = (int)extraout_RDX;
      if (0 < iVar6) {
        lVar4 = *(long *)(code_ptr + 0x18);
        uVar10 = 0;
        do {
          *(int *)(lVar7 * 4 + lVar4 + uVar10 * 4) = type + (int)uVar10;
          uVar10 = uVar10 + 1;
        } while ((extraout_RDX & 0xffffffff) != uVar10);
      }
      if (1 < iVar6) {
        lVar7 = lVar7 * 4 + *(long *)(code_ptr + 0x18);
        lVar4 = *(long *)(code_ptr + 0x10);
        uVar8 = 1;
        uVar10 = 0;
        do {
          uVar9 = uVar10 + 1;
          uVar11 = uVar8;
          do {
            iVar2 = *(int *)(lVar7 + uVar10 * 4);
            uVar1 = *(ushort *)(lVar4 + (long)iVar2 * 8);
            iVar14 = 0x20;
            iVar12 = 0x20;
            if ((-1 < (char)uVar1) && (iVar12 = 0, (uVar1 & 1) != 0)) {
              iVar12 = 0;
              uVar13 = 0;
              do {
                iVar12 = iVar12 + (uint)((*(uint *)(lVar4 + 4 + (long)iVar2 * 8) >> (uVar13 & 0x1f)
                                         & 1) != 0);
                uVar13 = uVar13 + 1;
              } while (uVar13 != 0x20);
              iVar12 = 0x21 - iVar12;
            }
            iVar3 = *(int *)(lVar7 + uVar11 * 4);
            uVar1 = *(ushort *)(lVar4 + (long)iVar3 * 8);
            if ((-1 < (char)uVar1) && (iVar14 = 0, (uVar1 & 1) != 0)) {
              iVar14 = 0;
              uVar13 = 0;
              do {
                iVar14 = iVar14 + (uint)((*(uint *)(lVar4 + 4 + (long)iVar3 * 8) >> (uVar13 & 0x1f)
                                         & 1) != 0);
                uVar13 = uVar13 + 1;
              } while (uVar13 != 0x20);
              iVar14 = 0x21 - iVar14;
            }
            if (iVar12 < iVar14) {
              *(int *)(lVar7 + uVar10 * 4) = iVar3;
              *(int *)(lVar7 + uVar11 * 4) = iVar2;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != (extraout_RDX & 0xffffffff));
          uVar8 = uVar8 + 1;
          uVar10 = uVar9;
        } while (uVar9 != iVar6 - 1);
      }
      return SUB81(lVar7,0);
    }
    lVar7 = lVar7 - (long)code_ptr;
    if ((int)lVar7 != lVar7) {
      return false;
    }
  }
  *(int *)code_ptr = (int)lVar7;
  return true;
}

Assistant:

static bool patch_reloc(tcg_insn_unit *code_ptr, int type,
                        intptr_t value, intptr_t addend)
{
    value += addend;
    switch(type) {
    case R_386_PC32:
        value -= (uintptr_t)code_ptr;
        if (value != (int32_t)value) {
            return false;
        }
        /* FALLTHRU */
    case R_386_32:
        tcg_patch32(code_ptr, value);
        break;
    case R_386_PC8:
        value -= (uintptr_t)code_ptr;
        if (value != (int8_t)value) {
            return false;
        }
        tcg_patch8(code_ptr, value);
        break;
    default:
        tcg_abort();
    }
    return true;
}